

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textSubtitles.cpp
# Opt level: O1

long __thiscall
text_subtitles::TextToPGSConverter::composeVideoDescriptor(TextToPGSConverter *this,uint8_t *buff)

{
  int iVar1;
  
  AV_WB16(buff,this->m_videoWidth);
  AV_WB16(buff + 2,this->m_videoHeight);
  iVar1 = PGSStreamReader::calcFpsIndex(this->m_videoFps);
  buff[4] = (char)iVar1 << 4;
  return 5;
}

Assistant:

long TextToPGSConverter::composeVideoDescriptor(uint8_t* buff) const
{
    uint8_t* curPos = buff;
    AV_WB16(curPos, m_videoWidth);
    curPos += 2;
    AV_WB16(curPos, m_videoHeight);
    curPos += 2;
    *curPos++ = static_cast<uint8_t>(PGSStreamReader::calcFpsIndex(m_videoFps) << 4);
    return static_cast<long>(curPos - buff);
}